

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  char *local_40;
  char *pThird;
  float Second;
  float First;
  char *pHead;
  Scl_Item_t *pChild;
  Scl_Item_t *pItem;
  Vec_Str_t *vOut_local;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  iVar1 = Scl_LibertyItemNum(p,pSVar2,"wire_load_selection");
  Vec_StrPutI_(vOut,iVar1);
  Vec_StrPut_(vOut);
  pSVar2 = Scl_LibertyRoot(p);
  pChild = Scl_LibertyItem(p,pSVar2->Child);
  do {
    if (pChild == (Scl_Item_t *)0x0) {
      Vec_StrPut_(vOut);
      return;
    }
    iVar1 = Scl_LibertyCompare(p,pChild->Key,"wire_load_selection");
    if (iVar1 == 0) {
      pcVar3 = Scl_LibertyReadString(p,pChild->Head);
      Vec_StrPutS_(vOut,pcVar3);
      Vec_StrPut_(vOut);
      iVar1 = Scl_LibertyItemNum(p,pChild,"wire_load_from_area");
      Vec_StrPutI_(vOut,iVar1);
      Vec_StrPut_(vOut);
      for (pHead = (char *)Scl_LibertyItem(p,pChild->Child); pHead != (char *)0x0;
          pHead = (char *)Scl_LibertyItem(p,*(int *)(pHead + 0x20))) {
        iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pHead + 8),"wire_load_from_area");
        if (iVar1 == 0) {
          pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pHead + 0x10));
          pcVar3 = strtok(pcVar3," ,");
          dVar5 = atof(pcVar3);
          pcVar3 = strtok((char *)0x0," ,");
          dVar6 = atof(pcVar3);
          local_40 = strtok((char *)0x0," ");
          if (*local_40 == '\"') {
            sVar4 = strlen(local_40);
            if (local_40[sVar4 - 1] != '\"') {
              __assert_fail("pThird[strlen(pThird)-1] == \'\\\"\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                            ,0x3a3,"void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *, Vec_Str_t *)");
            }
            sVar4 = strlen(local_40);
            local_40[sVar4 - 1] = '\0';
            local_40 = local_40 + 1;
          }
          Vec_StrPutF_(vOut,(float)dVar5);
          Vec_StrPutF_(vOut,(float)dVar6);
          Vec_StrPutS_(vOut,local_40);
          Vec_StrPut_(vOut);
        }
      }
      Vec_StrPut_(vOut);
    }
    pChild = Scl_LibertyItem(p,pChild->Next);
  } while( true );
}

Assistant:

void Scl_LibertyReadWireLoadSelect( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load_selection") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load_selection" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "wire_load_from_area") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "wire_load_from_area" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            float  First  = atof( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ,") );
            char * pThird = strtok(NULL, " ");
            if ( pThird[0] == '\"' )
                assert(pThird[strlen(pThird)-1] == '\"'), pThird[strlen(pThird)-1] = 0, pThird++;
            Vec_StrPutF_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPutS_( vOut, pThird );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}